

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O3

void ntru_encode_plaintext(uint16_t *plaintext,uint p,BinarySink *bs)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if (p != 0) {
    uVar1 = 0;
    uVar3 = 0;
    iVar2 = 0;
    do {
      uVar1 = ((plaintext[uVar3] >> 1) + 0xffff >> 0x10 ^ 1) * (plaintext[uVar3] + 1) <<
              ((byte)iVar2 & 0x1f) | uVar1;
      iVar2 = iVar2 + 2;
      if ((ulong)p - 1 == uVar3 || iVar2 == 8) {
        BinarySink_put_byte(bs->binarysink_,(uchar)uVar1);
        iVar2 = 0;
        uVar1 = 0;
      }
      uVar3 = uVar3 + 1;
    } while (p != uVar3);
  }
  return;
}

Assistant:

void ntru_encode_plaintext(const uint16_t *plaintext, unsigned p,
                           BinarySink *bs)
{
    unsigned byte = 0, bitpos = 0;
    for (size_t i = 0; i < p; i++) {
        unsigned encoding = (plaintext[i] + 1) * iszero(plaintext[i] >> 1);
        byte |= encoding << bitpos;
        bitpos += 2;
        if (bitpos == 8 || i+1 == p) {
            put_byte(bs, byte);
            byte = 0;
            bitpos = 0;
        }
    }
}